

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O1

void * worker_func(void *ctx)

{
  mutex_handle *mutex;
  uint uVar1;
  undefined8 *puVar2;
  condvar_handle *condvar;
  
  puVar2 = *(undefined8 **)((long)ctx + 0x10);
  condvar = (condvar_handle *)*puVar2;
  mutex = (mutex_handle *)(condvar + 2);
  mutex_lock(mutex);
  if (1 < *(uint *)&condvar[7].priv) {
    do {
      while ((uVar1 = *(uint *)&condvar[7].priv, uVar1 == 4 || (uVar1 == 2))) {
        *(uint *)&condvar[7].priv = (uint)(uVar1 != 2) * 2 + 1;
        mutex_unlock(mutex);
        (*(code *)puVar2[1])(puVar2);
        mutex_lock(mutex);
      }
      if (uVar1 < 2) break;
      *(undefined4 *)&condvar[7].priv = 5;
      condvar_wake_all(condvar + 1);
      if (*(uint32_t *)((long)puVar2 + 0x1c) == 0) {
        condvar_wait(condvar,mutex);
      }
      else {
        condvar_wait_time(condvar,mutex,*(uint32_t *)((long)puVar2 + 0x1c));
        if (*(int *)&condvar[7].priv == 5) {
          *(undefined4 *)&condvar[7].priv = 4;
        }
      }
    } while (1 < *(uint *)&condvar[7].priv);
  }
  *(undefined4 *)&condvar[7].priv = 0;
  mutex_unlock(mutex);
  return (void *)0x0;
}

Assistant:

static void *worker_func(void *ctx)
{
	struct thread_handle *th = ctx;
	struct worker_handle *wh = th->func_ctx;
	struct worker_priv *priv = wh->priv;

	mutex_lock(&priv->mutex);

	while (priv->state > WORKER_STOPPING) {
		while (priv->state == WORKER_SIGNALED ||
		       priv->state == WORKER_STOPPING_AFTER_WORK) {
			if (priv->state == WORKER_STOPPING_AFTER_WORK)
				priv->state = WORKER_STOPPING;
			else
				priv->state = WORKER_BUSY;
			mutex_unlock(&priv->mutex);
			wh->func_ptr(wh);
			mutex_lock(&priv->mutex);
		}

		if (priv->state <= WORKER_STOPPING)
			break;

		priv->state = WORKER_IDLE;

		condvar_wake_all(&priv->condvar_idle);

		if (wh->periodic_wake > 0) {
			condvar_wait_time(&priv->condvar, &priv->mutex,
					  wh->periodic_wake);
			if (priv->state == WORKER_IDLE)
				priv->state = WORKER_SIGNALED;
		} else {
			condvar_wait(&priv->condvar, &priv->mutex);
		}
	}

	priv->state = WORKER_STOPPED;

	mutex_unlock(&priv->mutex);

	return NULL;
}